

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O3

void av1_fwd_txfm2d_16x32_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  undefined8 *puVar1;
  char cVar2;
  byte bVar3;
  code *pcVar4;
  code *pcVar5;
  int iVar6;
  int8_t *piVar7;
  int *piVar8;
  undefined7 in_register_00000009;
  ulong uVar9;
  int32_t *piVar10;
  long lVar11;
  int *piVar12;
  int iVar13;
  long lVar14;
  __m128i round;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qb;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  __m128i in [128];
  undefined8 local_838;
  int aiStack_830 [254];
  longlong local_438 [129];
  undefined1 auVar15 [16];
  
  piVar7 = av1_fwd_txfm_shift_ls[9];
  uVar9 = (ulong)(uint)((int)CONCAT71(in_register_00000009,tx_type) << 3);
  pcVar4 = *(code **)((long)col_highbd_txfm8x32_arr + uVar9);
  pcVar5 = *(code **)((long)row_highbd_txfm8x32_arr + uVar9);
  cVar2 = *av1_fwd_txfm_shift_ls[9];
  lVar14 = 0;
  load_buffer_16x16(input,(__m128i *)&local_838,stride,0,0,(int)cVar2);
  load_buffer_16x16(input + (stride << 4),(__m128i *)local_438,stride,0,0,(int)cVar2);
  do {
    (*pcVar4)((long)&local_838 + lVar14,(long)&local_838 + lVar14,0xc,4);
    lVar14 = lVar14 + 0x10;
  } while (lVar14 != 0x40);
  iVar13 = -(int)piVar7[1];
  col_txfm_16x16_rounding((__m128i *)&local_838,iVar13);
  col_txfm_16x16_rounding((__m128i *)local_438,iVar13);
  piVar8 = aiStack_830 + 0x2e;
  piVar10 = coeff + 0x60;
  lVar14 = 0;
  do {
    lVar11 = -0x80;
    piVar12 = piVar8;
    do {
      auVar17 = *(undefined1 (*) [16])(piVar12 + -0x30);
      iVar6 = piVar12[-0xf];
      iVar13 = piVar12[1];
      auVar21._0_8_ = auVar17._0_8_;
      auVar21._8_4_ = auVar17._4_4_;
      auVar21._12_4_ = piVar12[-0x1f];
      auVar19._4_4_ = piVar12[-0x20];
      auVar19._0_4_ = auVar17._0_4_;
      auVar16._0_8_ = CONCAT44(piVar12[-0x1e],auVar17._8_4_);
      auVar16._8_4_ = auVar17._12_4_;
      auVar16._12_4_ = piVar12[-0x1d];
      auVar19._12_4_ = *piVar12;
      auVar19._8_4_ = piVar12[-0x10];
      auVar17._0_8_ = CONCAT44(piVar12[2],piVar12[-0xe]);
      auVar17._8_4_ = piVar12[-0xd];
      auVar17._12_4_ = piVar12[3];
      *(undefined1 (*) [16])((long)piVar10 + lVar11 + -0x100) = auVar19;
      puVar1 = (undefined8 *)((long)piVar10 + lVar11 + -0x80);
      *puVar1 = auVar21._8_8_;
      *(int *)(puVar1 + 2) = iVar6;
      *(int *)((long)puVar1 + 0x14) = iVar13;
      *(undefined8 *)((long)piVar10 + lVar11) = auVar16._0_8_;
      ((undefined8 *)((long)piVar10 + lVar11))[1] = auVar17._0_8_;
      puVar1 = (undefined8 *)((long)piVar10 + lVar11 + 0x80);
      *puVar1 = auVar16._8_8_;
      puVar1[1] = auVar17._8_8_;
      piVar12 = piVar12 + 0x40;
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0);
    lVar14 = lVar14 + 1;
    piVar8 = piVar8 + 4;
    piVar10 = piVar10 + 0x80;
  } while (lVar14 != 4);
  (*pcVar5)(coeff,&local_838,0xd,8);
  auVar15._8_8_ = extraout_XMM1_Qb;
  auVar15._0_8_ = extraout_XMM1_Qa;
  bVar3 = piVar7[2];
  if ((char)bVar3 < '\0') {
    iVar13 = 1 << (~bVar3 & 0x1f);
    lVar14 = 0;
    auVar16 = ZEXT416((uint)-(int)(char)bVar3);
    auVar17 = pmovsxwd(auVar17,0x16a116a116a116a1);
    auVar19 = pmovsxwd(auVar19,0x800080008000800);
    do {
      auVar20._0_4_ = *(int *)((long)&local_838 + lVar14) + iVar13 >> auVar16;
      auVar20._4_4_ = *(int *)((long)aiStack_830 + lVar14 + -4) + iVar13 >> auVar16;
      auVar20._8_4_ = *(int *)((long)aiStack_830 + lVar14) + iVar13 >> auVar16;
      auVar20._12_4_ = *(int *)((long)aiStack_830 + lVar14 + 4) + iVar13 >> auVar16;
      auVar21 = pmulld(auVar20,auVar17);
      piVar8 = (int *)((long)coeff + lVar14);
      *piVar8 = auVar21._0_4_ + auVar19._0_4_ >> 0xc;
      piVar8[1] = auVar21._4_4_ + auVar19._4_4_ >> 0xc;
      piVar8[2] = auVar21._8_4_ + auVar19._8_4_ >> 0xc;
      piVar8[3] = auVar21._12_4_ + auVar19._12_4_ >> 0xc;
      lVar14 = lVar14 + 0x10;
    } while (lVar14 != 0x800);
  }
  else {
    lVar14 = 0;
    auVar16 = pmovsxwd(auVar15,0x16a116a116a116a1);
    auVar17 = pmovsxwd(auVar17,0x800080008000800);
    do {
      auVar18._0_4_ = *(int *)((long)&local_838 + lVar14) << (int)(char)bVar3;
      auVar18._4_4_ = *(undefined4 *)((long)aiStack_830 + lVar14 + -4);
      auVar18._8_4_ = *(undefined4 *)((long)aiStack_830 + lVar14);
      auVar18._12_4_ = *(undefined4 *)((long)aiStack_830 + lVar14 + 4);
      auVar19 = pmulld(auVar18,auVar16);
      piVar8 = (int *)((long)coeff + lVar14);
      *piVar8 = auVar19._0_4_ + auVar17._0_4_ >> 0xc;
      piVar8[1] = auVar19._4_4_ + auVar17._4_4_ >> 0xc;
      piVar8[2] = auVar19._8_4_ + auVar17._8_4_ >> 0xc;
      piVar8[3] = auVar19._12_4_ + auVar17._12_4_ >> 0xc;
      lVar14 = lVar14 + 0x10;
    } while (lVar14 != 0x800);
  }
  return;
}

Assistant:

void av1_fwd_txfm2d_16x32_sse4_1(const int16_t *input, int32_t *coeff,
                                 int stride, TX_TYPE tx_type, int bd) {
  __m128i in[128];
  __m128i *outcoef128 = (__m128i *)coeff;
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_16X32];
  const int txw_idx = get_txw_idx(TX_16X32);
  const int txh_idx = get_txh_idx(TX_16X32);
  const fwd_transform_1d_sse4_1 col_txfm = col_highbd_txfm8x32_arr[tx_type];
  const fwd_transform_1d_sse4_1 row_txfm = row_highbd_txfm8x32_arr[tx_type];
  int bitcol = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int bitrow = av1_fwd_cos_bit_row[txw_idx][txh_idx];

  // column transform
  load_buffer_16x16(input, in, stride, 0, 0, shift[0]);
  load_buffer_16x16(input + 16 * stride, in + 64, stride, 0, 0, shift[0]);

  for (int i = 0; i < 4; i++) {
    col_txfm((in + i), (in + i), bitcol, 4);
  }
  col_txfm_16x16_rounding(&in[0], -shift[1]);
  col_txfm_16x16_rounding(&in[64], -shift[1]);
  transpose_8nx8n(in, outcoef128, 16, 32);

  // row transform
  row_txfm(outcoef128, in, bitrow, 8);
  av1_round_shift_rect_array_32_sse4_1(in, outcoef128, 128, -shift[2],
                                       NewSqrt2);
  (void)bd;
}